

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBTree.h
# Opt level: O1

RBTree<int> * __thiscall BinTrees::RBTree<int>::i<int_const&>(RBTree<int> *this,int *v)

{
  int iVar1;
  BinTree<int> *pBVar2;
  BinTree<int> *pBVar3;
  runtime_error *this_00;
  BinTree<int> *pBVar4;
  int iVar5;
  BinTree<int> *pBVar6;
  BinTree<int> **ppBVar7;
  RBTree<int> *local_20;
  
  iVar1 = *v;
  local_20 = this;
  iVar5 = (this->super_BinSTree<int>).super_BinTree<int>.v;
  if (iVar5 == iVar1) {
    ppBVar7 = (BinTree<int> **)&local_20;
  }
  else {
    do {
      if (iVar5 < iVar1) {
        ppBVar7 = &(local_20->super_BinSTree<int>).super_BinTree<int>.r;
        pBVar2 = (local_20->super_BinSTree<int>).super_BinTree<int>.r;
      }
      else {
        ppBVar7 = &(local_20->super_BinSTree<int>).super_BinTree<int>.l;
        pBVar2 = (local_20->super_BinSTree<int>).super_BinTree<int>.l;
      }
      if (pBVar2 == (BinTree<int> *)0x0) break;
      local_20 = (RBTree<int> *)*ppBVar7;
      iVar5 = (local_20->super_BinSTree<int>).super_BinTree<int>.v;
      ppBVar7 = (BinTree<int> **)&local_20;
    } while (iVar5 != iVar1);
  }
  if (*ppBVar7 != (BinTree<int> *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Repeated insert.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pBVar3 = (BinTree<int> *)operator_new(0x28);
  ((BinTree<int> *)&pBVar3->v)->v = iVar1;
  pBVar3->l = (BinTree<int> *)0x0;
  pBVar3->r = (BinTree<int> *)0x0;
  pBVar3->p = (BinTree<int> *)local_20;
  *(bool *)&pBVar3[1].v = local_20 != (RBTree<int> *)0x0;
  *ppBVar7 = pBVar3;
  pBVar2 = pBVar3->p;
  do {
    if ((pBVar2 == (BinTree<int> *)0x0) || ((char)pBVar2[1].v != '\x01')) {
      this->c = false;
      return this;
    }
    pBVar4 = pBVar2->p;
    pBVar6 = pBVar4->l;
    if (pBVar2 == pBVar6) {
      pBVar6 = pBVar4->r;
      if ((pBVar6 != (BinTree<int> *)0x0) && ((char)((BinTree<int> *)&pBVar6[1].v)->v == '\x01'))
      goto LAB_00102a27;
      pBVar4 = pBVar3;
      if (pBVar3 == pBVar2->r) {
        this = (RBTree<int> *)BinSTree<int>::LR(&this->super_BinSTree<int>,(BinSTree<int> *)pBVar2);
        pBVar4 = pBVar2;
      }
      pBVar2 = pBVar4->p;
      *(undefined1 *)&pBVar2[1].v = 0;
      pBVar2 = pBVar2->p;
      *(undefined1 *)&((BinTree<int> *)&pBVar2[1].v)->v = 1;
      this = (RBTree<int> *)BinSTree<int>::RR(&this->super_BinSTree<int>,(BinSTree<int> *)pBVar2);
    }
    else if ((pBVar6 == (BinTree<int> *)0x0) || ((char)((BinTree<int> *)&pBVar6[1].v)->v != '\x01'))
    {
      pBVar4 = pBVar3;
      if (pBVar3 == pBVar2->l) {
        this = (RBTree<int> *)BinSTree<int>::RR(&this->super_BinSTree<int>,(BinSTree<int> *)pBVar2);
        pBVar4 = pBVar2;
      }
      pBVar2 = pBVar4->p;
      *(undefined1 *)&pBVar2[1].v = 0;
      pBVar2 = pBVar2->p;
      *(undefined1 *)&((BinTree<int> *)&pBVar2[1].v)->v = 1;
      this = (RBTree<int> *)BinSTree<int>::LR(&this->super_BinSTree<int>,(BinSTree<int> *)pBVar2);
    }
    else {
LAB_00102a27:
      *(undefined1 *)&pBVar2[1].v = 0;
      *(undefined1 *)&((BinTree<int> *)&pBVar6[1].v)->v = 0;
      *(undefined1 *)&((BinTree<int> *)&pBVar4[1].v)->v = 1;
    }
    pBVar2 = pBVar4->p;
    pBVar3 = pBVar4;
  } while( true );
}

Assistant:

RBTree<T> *RBTree<T>::i(F &&v) {
        BinTree<T> *xp = nullptr;
        BinTree<T> *&ip = this->unsafe_search(v, xp);
        auto root = this;
        if (ip) throw std::runtime_error("Repeated insert.");
        else {
            ip = new RBTree(std::forward<F>(v), xp);
        }
        auto i = static_cast<RBTree<T> *>(ip);
        RBTree<T> *y = nullptr;
        while (i->p() && i->p()->c) {
            if (i->p() == i->p()->p()->l()) {
                y = i->p()->p()->r();
                if (y && y->c) {
                    i->p()->c = false;
                    y->c = false;
                    i->p()->p()->c = true;
                    i = i->p()->p();
                } else {
                    if (i == i->p()->r()) {
                        i = i->p();
                        root = static_cast<RBTree<T> *>(root->LR(i));
                    }
                    i->p()->c = false;
                    i->p()->p()->c = true;
                    root = static_cast<RBTree<T> *>(root->RR(i->p()->p()));
                }
            } else {
                y = i->p()->p()->l();
                if (y && y->c) {
                    i->p()->c = false;
                    y->c = false;
                    i->p()->p()->c = true;
                    i = i->p()->p();
                } else {
                    if (i == i->p()->l()) {
                        i = i->p();
                        root = static_cast<RBTree<T> *>(root->RR(i));
                    }
                    i->p()->c = false;
                    i->p()->p()->c = true;
                    root = static_cast<RBTree<T> *>(root->LR(i->p()->p()));
                }
            }
        }
        root->c = false;

        return root;
    }